

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

string * __thiscall
kratos::VarVarSlice::to_string_abi_cxx11_(string *__return_storage_ptr__,VarVarSlice *this)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  long *local_78;
  undefined8 uStack_70;
  long *local_68;
  undefined8 uStack_60;
  long *local_58;
  undefined8 uStack_50;
  long local_48 [2];
  long *local_38;
  undefined8 uStack_30;
  long local_28 [2];
  
  (*(((this->super_VarSlice).parent_var)->super_IRNode)._vptr_IRNode[0x1f])(&local_58);
  (*(this->sliced_var_->super_IRNode)._vptr_IRNode[0x1f])(&local_38);
  local_78 = local_58;
  uStack_70 = uStack_50;
  local_68 = local_38;
  uStack_60 = uStack_30;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x8;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_78;
  fmt::v7::detail::vformat_abi_cxx11_(__return_storage_ptr__,(detail *)"{0}[{1}]",format_str,args);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VarVarSlice::to_string() const {
    return ::format("{0}[{1}]", parent_var->to_string(), sliced_var_->to_string());
}